

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shk.c
# Opt level: O0

boolean costly_spot(xchar x,xchar y)

{
  level *lev;
  char cVar1;
  int iVar2;
  char *pcVar3;
  monst *mtmp;
  bool local_22;
  byte local_21;
  monst *shkp;
  xchar y_local;
  xchar x_local;
  
  lev = level;
  if ((*(uint *)&(level->flags).field_0x8 & 1) != 0) {
    pcVar3 = in_rooms(level,x,y,0x12);
    mtmp = shop_keeper(lev,*pcVar3);
    if ((mtmp != (monst *)0x0) && (iVar2 = inhishop(mtmp), iVar2 != 0)) {
      cVar1 = inside_shop(level,x,y);
      local_21 = 0;
      if (cVar1 != '\0') {
        local_22 = false;
        if (x == (char)mtmp[0x1b].movement) {
          local_22 = y == *(char *)((long)&mtmp[0x1b].movement + 1);
        }
        local_21 = local_22 ^ 0xff;
      }
      return local_21 & 1;
    }
  }
  return '\0';
}

Assistant:

boolean costly_spot(xchar x, xchar y)
{
	struct monst *shkp;

	if (!level->flags.has_shop) return FALSE;
	shkp = shop_keeper(level, *in_rooms(level, x, y, SHOPBASE));
	if (!shkp || !inhishop(shkp)) return FALSE;

	return((boolean)(inside_shop(level, x, y) &&
		!(x == ESHK(shkp)->shk.x &&
			y == ESHK(shkp)->shk.y)));
}